

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.hpp
# Opt level: O1

string * __thiscall
duckdb::ErrorManager::FormatException<std::__cxx11::string>
          (string *__return_storage_ptr__,ErrorManager *this,ClientContext *context,
          ErrorType error_type,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  long lVar1;
  DatabaseInstance *pDVar2;
  type this_00;
  undefined6 in_register_0000000a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->
                     ((shared_ptr<duckdb::DatabaseInstance,_true> *)
                      &(this->custom_errors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  this_00 = unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>,_true>::
            operator*(&(pDVar2->config).error_manager);
  lVar1 = *(long *)CONCAT62(in_register_0000000a,error_type);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,lVar1,
             ((long *)CONCAT62(in_register_0000000a,error_type))[1] + lVar1);
  FormatException<std::__cxx11::string>(__return_storage_ptr__,this_00,(ErrorType)context,&local_48)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string FormatException(ClientContext &context, ErrorType error_type, ARGS... params) {
		return Get(context).FormatException(error_type, params...);
	}